

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O0

void __thiscall
absl::strings_internal::BigUnsigned<4>::BigUnsigned(BigUnsigned<4> *this,string_view sv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  const_iterator pvVar4;
  BigUnsigned<4> *this_00;
  BigUnsigned<4> *in_RSI;
  char *in_RDI;
  int exponent_adjust;
  int in_stack_ffffffffffffff9c;
  _func_bool_uchar *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  in_RDI[0] = '\0';
  in_RDI[1] = '\0';
  in_RDI[2] = '\0';
  in_RDI[3] = '\0';
  pcVar3 = in_RDI + 4;
  do {
    pcVar3[0] = '\0';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3 = pcVar3 + 4;
  } while (pcVar3 != in_RDI + 0x14);
  pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffff0);
  iVar2 = (int)((ulong)pcVar3 >> 0x20);
  std::basic_string_view<char,_std::char_traits<char>_>::end
            ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffff0);
  pcVar3 = std::find_if_not<char_const*,bool(*)(unsigned_char)>
                     (in_stack_ffffffffffffffc0,pvVar4,in_stack_ffffffffffffffb0);
  pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffff0);
  if ((pcVar3 == pvVar4) &&
     (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         &stack0xfffffffffffffff0), !bVar1)) {
    std::basic_string_view<char,_std::char_traits<char>_>::data
              ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffff0);
    this_00 = (BigUnsigned<4> *)
              std::basic_string_view<char,_std::char_traits<char>_>::data
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         &stack0xfffffffffffffff0);
    std::basic_string_view<char,_std::char_traits<char>_>::size
              ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffff0);
    Digits10();
    iVar2 = ReadDigits(in_RSI,in_RDI,
                       (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),iVar2);
    if (0 < iVar2) {
      MultiplyByTenToTheNth(this_00,in_stack_ffffffffffffff9c);
    }
  }
  return;
}

Assistant:

explicit BigUnsigned(absl::string_view sv) : size_(0), words_{} {
    // Check for valid input, returning a 0 otherwise.  This is reasonable
    // behavior only because this constructor is for unit tests.
    if (std::find_if_not(sv.begin(), sv.end(), ascii_isdigit) != sv.end() ||
        sv.empty()) {
      return;
    }
    int exponent_adjust =
        ReadDigits(sv.data(), sv.data() + sv.size(), Digits10() + 1);
    if (exponent_adjust > 0) {
      MultiplyByTenToTheNth(exponent_adjust);
    }
  }